

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

double __thiscall slang::SVInt::trunc(SVInt *this,double __x)

{
  byte bVar1;
  undefined1 uVar2;
  SVInt *pSVar3;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __s;
  uint in_EDX;
  ulong uVar4;
  ulong *src;
  SVInt *pSVar5;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  undefined1 local_34;
  byte local_33;
  
  bVar1 = *(byte *)((long)in_RSI + 0xd);
  if ((uint)in_RSI[1] < 0x41 && (bVar1 & 1) == 0) {
    uVar4 = ~(-1L << ((byte)in_EDX & 0x3f));
    if (in_EDX == 0x40) {
      uVar4 = 0xffffffffffffffff;
    }
    SVInt(this,in_EDX,uVar4 & *in_RSI,*(bool *)((long)in_RSI + 0xc));
    dVar6 = extraout_XMM0_Qa;
  }
  else {
    (this->super_SVIntStorage).field_0.val = 0;
    (this->super_SVIntStorage).bitWidth = 1;
    (this->super_SVIntStorage).signFlag = false;
    (this->super_SVIntStorage).unknownFlag = false;
    if (in_EDX < 0x41 && (bVar1 & 1) == 0) {
      SVInt((SVInt *)&local_40,in_EDX,0,*(bool *)((long)in_RSI + 0xc));
    }
    else {
      uVar2 = *(undefined1 *)((long)in_RSI + 0xc);
      uVar4 = (ulong)(((in_EDX + 0x3f >> 6) << (bVar1 & 0x1f)) << 3);
      __s.pVal = (uint64_t *)operator_new__(uVar4);
      memset(__s.pVal,0,uVar4);
      local_40.pVal = __s.pVal;
      local_38 = in_EDX;
      local_34 = uVar2;
      local_33 = bVar1;
    }
    operator=(this,(SVInt *)&local_40);
    if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    pSVar3 = (SVInt *)(this->super_SVIntStorage).field_0.pVal;
    pSVar5 = this;
    if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar5 = pSVar3;
    }
    if (0x40 < (this->super_SVIntStorage).bitWidth) {
      pSVar5 = pSVar3;
    }
    src = in_RSI;
    if ((*(byte *)((long)in_RSI + 0xd) & 1) != 0) {
      src = (ulong *)*in_RSI;
    }
    if (0x40 < (uint)in_RSI[1]) {
      src = (ulong *)*in_RSI;
    }
    bitcpy((uint64_t *)pSVar5,0,src,in_EDX,0);
    if (*(char *)((long)in_RSI + 0xd) == '\x01') {
      pSVar3 = (SVInt *)(this->super_SVIntStorage).field_0.val;
      pSVar5 = this;
      if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
        pSVar5 = pSVar3;
      }
      if (0x40 < (this->super_SVIntStorage).bitWidth) {
        pSVar5 = pSVar3;
      }
      bitcpy(&(&(pSVar5->super_SVIntStorage).field_0)[in_EDX + 0x3f >> 6].val,0,
             (uint64_t *)((ulong)((int)in_RSI[1] + 0x3fU >> 6) * 8 + *in_RSI),in_EDX,0);
    }
    clearUnusedBits(this);
    checkUnknown(this);
    dVar6 = extraout_XMM0_Qa_00;
  }
  return dVar6;
}

Assistant:

SVInt SVInt::trunc(bitwidth_t bits) const {
    SLANG_ASSERT(bits > 0 && bits <= bitWidth);

    if (isSingleWord()) {
        uint64_t mask = bits == 64 ? UINT64_MAX : (1ull << bits) - 1;
        return SVInt(bits, val & mask, signFlag);
    }

    SVInt result;
    if (bits > 64 || unknownFlag)
        result = SVInt::allocZeroed(bits, signFlag, unknownFlag);
    else
        result = SVInt(bits, 0, signFlag);

    bitcpy(result.getRawData(), 0, getRawData(), bits, 0);

    if (unknownFlag) {
        // copy over preexisting unknown data
        uint32_t words = getNumWords(bits, false);
        bitcpy(result.getRawData() + words, 0, pVal + getNumWords() / 2, bits, 0);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}